

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.h
# Opt level: O0

int __thiscall libchess::Position::see_for(Position *this,Move move,array<int,_6UL> piece_values)

{
  Type TVar1;
  bool bVar2;
  reference pvVar3;
  PieceType *this_00;
  int *piVar4;
  undefined4 in_ESI;
  Square in_EDI;
  array<int,_6UL> in_stack_00000000;
  Position *in_stack_00000058;
  Move in_stack_00000064;
  Position pos;
  optional<libchess::PieceType> move_prom_piece_type;
  int piece_val;
  optional<libchess::Piece> square_pt;
  bool is_enpassant;
  Move *in_stack_fffffffffffffeb8;
  array<int,_6UL> *in_stack_fffffffffffffec0;
  Position *pPVar5;
  Move *in_stack_fffffffffffffec8;
  Position *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  Square in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  int iVar6;
  undefined4 in_stack_fffffffffffffee4;
  int local_10c;
  int local_dc [42];
  _Optional_payload_base<libchess::PieceType> local_34;
  MetaValueType<int> local_2c;
  int local_28;
  MetaValueType<int> local_24;
  _Optional_payload_base<libchess::Piece> local_20;
  undefined4 in_stack_ffffffffffffffec;
  uint uVar7;
  int local_4;
  
  pPVar5 = (Position *)&stack0x00000008;
  TVar1 = move_type_of(pPVar5,(Move)in_EDI.super_MetaValueType<int>.value_);
  uVar7 = CONCAT13(TVar1 == ENPASSANT,(int3)in_stack_ffffffffffffffec);
  local_24.value_ = (value_type)Move::to_square(in_stack_fffffffffffffeb8);
  local_20 = (_Optional_payload_base<libchess::Piece>)
             piece_on(in_stack_fffffffffffffed0,in_stack_fffffffffffffedc);
  bVar2 = std::optional::operator_cast_to_bool((optional<libchess::Piece> *)0x1350f2);
  if ((bVar2) || ((uVar7 & 0x1000000) != 0)) {
    if ((uVar7 & 0x1000000) == 0) {
      std::optional<libchess::Piece>::operator->((optional<libchess::Piece> *)0x13513d);
      local_2c.value_ = (value_type)Piece::type((Piece *)in_stack_fffffffffffffeb8);
      MetaValueType<int>::value(&local_2c);
      pvVar3 = std::array<int,_6UL>::at
                         (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
      local_10c = *pvVar3;
    }
    else {
      pvVar3 = std::array<int,_6UL>::at
                         (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
      local_10c = *pvVar3;
    }
    local_28 = local_10c;
    local_34 = (_Optional_payload_base<libchess::PieceType>)
               Move::promotion_piece_type(in_stack_fffffffffffffec8);
    bVar2 = std::optional::operator_cast_to_bool((optional<libchess::PieceType> *)0x135199);
    if (bVar2) {
      this_00 = std::optional<libchess::PieceType>::operator->
                          ((optional<libchess::PieceType> *)0x1351ac);
      MetaValueType<int>::value(&this_00->super_MetaValueType<int>);
      pvVar3 = std::array<int,_6UL>::at
                         (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
      iVar6 = *pvVar3;
      pvVar3 = std::array<int,_6UL>::at
                         (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
      local_28 = (iVar6 - *pvVar3) + local_28;
    }
    Position((Position *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (Position *)
             CONCAT44(in_stack_fffffffffffffedc.super_MetaValueType<int>.value_,
                      in_stack_fffffffffffffed8));
    make_move(in_stack_00000058,in_stack_00000064);
    local_dc[1] = 0;
    iVar6 = local_28;
    Move::to_square(in_stack_fffffffffffffeb8);
    pPVar5 = (Position *)pPVar5->piece_type_bb_[1].value_;
    local_dc[0] = see_to((Position *)CONCAT44(uVar7,in_ESI),in_EDI,in_stack_00000000);
    local_dc[0] = iVar6 - local_dc[0];
    piVar4 = std::max<int>(local_dc + 1,local_dc);
    local_4 = *piVar4;
    ~Position(pPVar5);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

inline int Position::see_for(Move move, std::array<int, 6> piece_values) {
    bool is_enpassant = move_type_of(move) == Move::Type::ENPASSANT;

    auto square_pt = piece_on(move.to_square());
    if (!square_pt && !is_enpassant) {
        return 0;
    }

    int piece_val = is_enpassant ? piece_values.at(0) : piece_values.at(square_pt->type().value());
    auto move_prom_piece_type = move.promotion_piece_type();
    if (move_prom_piece_type) {
        piece_val += piece_values.at(move_prom_piece_type->value()) - piece_values.at(0);
    }
    Position pos = *this;
    pos.make_move(move);
    return std::max(0, piece_val - pos.see_to(move.to_square(), piece_values));
}